

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullseq.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  char *aStrRegex;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  FILE *__stream;
  char *pcVar8;
  uint local_84;
  int local_80;
  uint local_7c;
  char *end;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  uint local_54;
  int local_50;
  int option_index;
  char *local_48;
  char *local_40;
  char *local_38;
  
  verbose_flag = 0;
  progname = *argv;
  if (argc < 4) {
switchD_00102c2b_caseD_68:
    show_usage(1);
    goto switchD_00102c2b_caseD_62;
  }
  local_84 = 0x32;
  local_54 = 0xffffffff;
  local_70 = 0;
  local_48 = (char *)0x0;
  local_40 = (char *)0x0;
  local_7c = 0xffffffff;
  local_50 = 0;
  local_80 = 0;
  local_68 = 0;
  local_60 = 0;
  local_38 = (char *)0x0;
  do {
    option_index = 0;
    iVar3 = getopt_long(argc,argv,"Vvh?cetq:i:g:Nn:m:a:l:",main::long_options,&option_index);
    pcVar1 = _optarg;
    if (iVar3 < 0x56) {
      if (iVar3 != -1) {
        if (iVar3 == 0x3f) goto LAB_00102e5b;
        if (iVar3 == 0x4e) {
          iVar3 = 0;
          local_50 = 1;
          goto LAB_00102e5e;
        }
        goto switchD_00102c2b_caseD_62;
      }
      iVar3 = 3;
    }
    else {
      switch(iVar3) {
      case 0x61:
        strtol(_optarg,&end,0);
        if ((*end == '\0') && (piVar7 = __errno_location(), *piVar7 == 0)) {
          local_7c = atoi(_optarg);
          goto LAB_00102e5b;
        }
        main_cold_3();
LAB_00102e92:
        local_70 = 1;
        iVar3 = 1;
        break;
      case 0x62:
      case 100:
      case 0x66:
      case 0x6a:
      case 0x6b:
      case 0x6f:
      case 0x70:
      case 0x72:
      case 0x73:
      case 0x75:
        goto switchD_00102c2b_caseD_62;
      case 99:
        QUALITY_SCORE = 0x3d;
        iVar3 = 0;
        local_60 = 1;
        break;
      case 0x65:
        iVar3 = 0;
        local_80 = 1;
        break;
      case 0x67:
        sVar5 = strlen(_optarg);
        pcVar6 = (char *)malloc(sVar5 + 1);
        local_38 = pcVar6;
        goto LAB_00102e50;
      case 0x68:
        goto switchD_00102c2b_caseD_68;
      case 0x69:
        sVar5 = strlen(_optarg);
        pcVar6 = (char *)malloc(sVar5 + 1);
        local_48 = pcVar6;
        goto LAB_00102e50;
      case 0x6c:
        strtol(_optarg,&end,0);
        if ((*end != '\0') || (piVar7 = __errno_location(), *piVar7 != 0)) {
          main_cold_1();
          goto LAB_00102e92;
        }
        local_84 = atoi(_optarg);
        goto LAB_00102e5b;
      case 0x6d:
        strtol(_optarg,&end,0);
        if ((*end != '\0') || (piVar7 = __errno_location(), *piVar7 != 0)) {
          main_cold_4();
          goto LAB_00102e92;
        }
        local_54 = atoi(_optarg);
        goto LAB_00102e5b;
      case 0x6e:
        sVar5 = strlen(_optarg);
        pcVar6 = (char *)malloc(sVar5 + 1);
        local_40 = pcVar6;
LAB_00102e50:
        strcpy(pcVar6,pcVar1);
        goto LAB_00102e5b;
      case 0x71:
        strtol(_optarg,&end,0);
        if ((*end != '\0') || (piVar7 = __errno_location(), *piVar7 != 0)) {
          main_cold_2();
          goto LAB_00102e92;
        }
        QUALITY_SCORE = atoi(_optarg);
        goto LAB_00102e5b;
      case 0x74:
        iVar3 = 0;
        local_68 = 1;
        break;
      case 0x76:
        verbose_flag = 1;
LAB_00102e5b:
        iVar3 = 0;
        break;
      default:
        if (iVar3 != 0x56) goto switchD_00102c2b_caseD_62;
        iVar3 = 0;
        printf("Version is %s\n","1.0.2");
      }
    }
LAB_00102e5e:
    aStrRegex = local_38;
    pcVar6 = local_40;
    pcVar1 = local_48;
    iVar2 = local_50;
    uVar4 = local_54;
  } while (iVar3 == 0);
  if (iVar3 == 3) {
    if (verbose_flag != 0) {
      fwrite("verbose flag is set\n",0x14,1,_stderr);
      fprintf(_stderr,"Input is %s\n",pcVar1);
      if ((int)local_60 != 0) {
        main_cold_5();
      }
      if (iVar2 == 0) {
        if (pcVar6 != (char *)0x0) {
          if (local_80 == 0) {
            pcVar8 = "Names in %s will be included\n";
          }
          else {
            pcVar8 = "Names in %s will be excluded\n";
          }
          fprintf(_stderr,pcVar8,pcVar6);
        }
      }
      else if (local_80 == 0) {
        main_cold_7();
      }
      else {
        main_cold_6();
      }
      if (aStrRegex != (char *)0x0) {
        pcVar8 = "Only sequences not matching %s will be output\n";
        if (local_80 == 0) {
          pcVar8 = "Only sequences matching %s will be output\n";
        }
        fprintf(_stderr,pcVar8,aStrRegex);
      }
      if (0 < (int)local_7c) {
        fprintf(_stderr,"Only sequences less than %i will be output\n",(ulong)local_7c);
      }
      if (0 < (int)uVar4) {
        fprintf(_stderr,"Only sequences greater than %i will be output\n",(ulong)uVar4);
      }
      if (0 < (int)local_84) {
        fprintf(_stderr,"Output will be %i columns long\n",(ulong)local_84);
      }
      if (0 < (int)local_68) {
        main_cold_8();
      }
    }
    if (pcVar1 == (char *)0x0) {
      main_cold_14();
    }
    else if ((pcVar6 == (char *)0x0) || (iVar3 = strcmp(pcVar1,pcVar6), iVar3 != 0)) {
      if (iVar2 == 0 || pcVar6 == (char *)0x0) {
        if ((aStrRegex == (char *)0x0) || (pcVar6 == (char *)0x0 && iVar2 == 0)) {
          if ((int)uVar4 < (int)local_7c || ((int)local_7c < 1 || (int)uVar4 < 1)) {
            if (pcVar6 == (char *)0x0 && iVar2 == 0) {
              if (aStrRegex == (char *)0x0) {
                uVar4 = pull_by_size(pcVar1,uVar4,local_7c,local_84,(int)local_60,(int)local_68);
              }
              else {
                uVar4 = pull_by_re(pcVar1,aStrRegex,uVar4,local_7c,local_84,local_80,(int)local_60,
                                   (int)local_68);
              }
              __stream = (FILE *)0x0;
LAB_00102ff0:
              free(pcVar1);
              if (pcVar6 != (char *)0x0) {
                free(pcVar6);
              }
              if (__stream != (FILE *)0x0) {
                fclose(__stream);
              }
              if (aStrRegex != (char *)0x0) {
                free(aStrRegex);
              }
              if (verbose_flag != 0) {
                fprintf(_stderr,"Pulled %i entries\n",(ulong)uVar4);
              }
              fclose(_stderr);
              fclose(_stdout);
              fclose(_stdin);
              return 0;
            }
            __stream = _stdin;
            if ((pcVar6 == (char *)0x0) || (__stream = fopen(pcVar6,"r"), __stream != (FILE *)0x0))
            {
              uVar4 = pull_by_name(pcVar1,(FILE *)__stream,uVar4,local_7c,local_84,local_80,
                                   (int)local_60,(int)local_68);
              goto LAB_00102ff0;
            }
            main_cold_10();
            goto LAB_00102f6b;
          }
          main_cold_9();
        }
        else {
          main_cold_11();
        }
      }
      else {
        main_cold_12();
      }
    }
    else {
      main_cold_13();
    }
    iVar3 = 1;
  }
  else {
LAB_00102f6b:
    iVar3 = (int)local_70;
  }
  return iVar3;
switchD_00102c2b_caseD_62:
  abort();
}

Assistant:

int main(int argc, char *argv[]) {
	int c;
	char *in = NULL,*names = NULL;
	FILE *names_fp = NULL;
	int min = -1, max = -1;
	int names_from_stdin = 0;
	int exclude = 0;
	int count = 0;
	int just_count = 0; /* flag for just counting the output */
	int convert = 0;
	int length = 50;
	long value;
	char *end;
	char *aStrRegex = NULL;

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */

	progname = argv[0];
	if (argc < 4) { /* progname + at least 3 other args */
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",     no_argument,       0, 'v'},
			{"convert",     no_argument,       0, 'c'},
			{"exclude",     no_argument,       0, 'e'},
			{"count",       no_argument,       0, 't'},
			{"version",     no_argument,       0, 'V'},
			{"help",        no_argument,       0, 'h'},
			{"input",       required_argument, 0, 'i'},
			{"regex",       required_argument, 0, 'g'},
			{"names",       required_argument, 0, 'n'},
			{"names_stdin", no_argument,       0, 'N'},
			{"min",         required_argument, 0, 'm'},
			{"max",         required_argument, 0, 'a'},
			{"length",      required_argument, 0, 'l'},
			{"quality",     required_argument, 0, 'q'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long (argc, argv, "Vvh?cetq:i:g:Nn:m:a:l:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'i':
				in = (char*) malloc(strlen(optarg)+1);
				strcpy(in,optarg);
				break;

			case 'g':
				aStrRegex = (char*) malloc(strlen(optarg)+1);
				strcpy(aStrRegex, optarg);
				break;

			case 'n':
				names = (char*) malloc(strlen(optarg)+1);
				strcpy(names, optarg);
				break;

			case 'N':
				names_from_stdin = 1;
				break;

			case 'm':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					min = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-m) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'a':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					max = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-a) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'c':
				convert = 1;
				QUALITY_SCORE = 61;
				break;

			case 't':
				just_count = 1;
				break;

			case 'q':
				value = strtol(optarg, &end, 0);
				if (*end == 0 && errno == 0) {
					QUALITY_SCORE = atoi(optarg);
				} else {
					fprintf(stderr, "Quality ASCII value (-q) is invalid - must be an ASCII code (e.g. 73, which is 'I')\n");
					return EXIT_FAILURE;
				}
				break;

			case 'e':
				exclude = 1;
				break;

			case 'l':
				value = strtol(optarg, &end,0);
				if (*end == '\0' && errno == 0) {
					length = atoi(optarg);
				} else {
					fprintf(stderr, "Sequence length value (-l) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'V':
				/* version */
				printf("Version is %s\n", PULLSEQ_VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"Input is %s\n", in);
		if (convert)
			fprintf(stderr,"Input will be converted between FASTQ and FASTA\n");
		if (names_from_stdin) {
			if (exclude)
				fprintf(stderr,"Names in STDIN will be excluded\n");
			else
				fprintf(stderr,"Names in STDIN will be included\n");

		} else if (names != NULL) {
			if (exclude) {
				fprintf(stderr,"Names in %s will be excluded\n", names);
            }
			else {
				fprintf(stderr,"Names in %s will be included\n", names);
            }
		}
		if (aStrRegex)
			if (exclude) {
				fprintf(stderr,"Only sequences not matching %s will be output\n", aStrRegex);
            }
			else {
				fprintf(stderr,"Only sequences matching %s will be output\n", aStrRegex);
            }
		if (max > 0)
			fprintf(stderr,"Only sequences less than %i will be output\n", max);
		if (min > 0)
			fprintf(stderr,"Only sequences greater than %i will be output\n", min);
		if (length > 0)
			fprintf(stderr,"Output will be %i columns long\n", length);
		if (just_count > 0)
			fprintf(stderr,"Output will be counted only\n");
	}

	/* check validity of given argument set */
	if (!in) {
		fprintf (stderr, "Error: Input file is required.\n");
		return EXIT_FAILURE;
	}

	if (names) {
		if (!strcmp(in, names)) {
			fprintf (stderr, "Error: Input file is same as names file.\n");
			return EXIT_FAILURE;
		}
	}

	if (names && names_from_stdin) {
		fprintf (stderr, "Error: Cannot use names from STDIN *and* names from a file.\n");
		return EXIT_FAILURE;
	}

	if (aStrRegex) {
		if (names || names_from_stdin) {
			fprintf (stderr, "Error: You can't use a names file or names from STDIN and a regex match.\n");
			return EXIT_FAILURE;
		}
	}

	if (min > 0 && max > 0) {
		if (max <= min) {
			fprintf (stderr, "Error: Max is less than or equal to min.\n");
			return EXIT_FAILURE;
		}
	}

	if (names || names_from_stdin) {
		if (names) {
			names_fp = fopen(names,"r");
			if (!names_fp) {
				fprintf(stderr,"%s - failed to open names file %s\n",progname, names);
				exit(EXIT_FAILURE);
			}
		} else {
			names_fp = stdin;
		}
		count = pull_by_name(in, names_fp, min, max, length, exclude, convert, just_count);
	} else if (aStrRegex) {
		count = pull_by_re(in, aStrRegex, min, max, length, exclude, convert, just_count);
	} else {
		count = pull_by_size(in, min, max, length, convert, just_count);
	}

	/* free up memory */
	free(in);

	if (names)
		free(names);

	if (names_fp)
		fclose(names_fp);

	if (aStrRegex)
		free(aStrRegex);

	if (verbose_flag)
		fprintf(stderr,"Pulled %i entries\n",count);

	/* close streams */
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}